

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

int __thiscall capnp::LocalClient::revoke(LocalClient *this,char *__file)

{
  Server *pSVar1;
  Disposer *pDVar2;
  int in_EAX;
  int iVar3;
  Fault local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if ((this->server).ptr.ptr == (Server *)0x0) {
    return in_EAX;
  }
  if ((this->revoker).ptr.isSet != false) {
    kj::Canceler::cancel(&(this->revoker).ptr.field_1.value,(Exception *)__file);
    if ((this->brokenException).ptr.isSet == true) {
      (this->brokenException).ptr.isSet = false;
      kj::Exception::~Exception(&(this->brokenException).ptr.field_1.value);
    }
    kj::Exception::Exception(&(this->brokenException).ptr.field_1.value,(Exception *)__file);
    (this->brokenException).ptr.isSet = true;
    pSVar1 = (this->server).ptr.ptr;
    (pSVar1->thisHook).ptr = (ClientHook *)0x0;
    pDVar2 = (this->server).ptr.disposer;
    (this->server).ptr.disposer = (Disposer *)0x0;
    (this->server).ptr.ptr = (Server *)0x0;
    iVar3 = (**pDVar2->_vptr_Disposer)
                      (pDVar2,(_func_int *)
                              ((long)&pSVar1->_vptr_Server + (long)pSVar1->_vptr_Server[-2]));
    return iVar3;
  }
  local_30.exception = (Exception *)0x0;
  local_28 = 0;
  uStack_20 = 0;
  kj::_::Debug::Fault::init
            (&local_30,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
            );
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

kj::Own<ClientHook> QueuedPipeline::getPipelinedCap(kj::Array<PipelineOp>&& ops) {
  KJ_IF_SOME(r, redirect) {
    return r->getPipelinedCap(kj::mv(ops));
  } else {
    return clientMap.findOrCreate(ops.asPtr(), [&]() {
      auto clientPromise = promise.addBranch()
          .then([ops = KJ_MAP(op, ops) { return op; }](kj::Own<PipelineHook> pipeline) {
        return pipeline->getPipelinedCap(kj::mv(ops));
      });
      return kj::HashMap<kj::Array<PipelineOp>, kj::Own<ClientHook>>::Entry {
        kj::mv(ops), kj::refcounted<QueuedClient>(kj::mv(clientPromise))
      };
    })->addRef();
  }
}